

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

iterator std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
         __copy_move_b<QList<std::pair<QString,int>>::iterator,QList<std::pair<QString,int>>::iterator>
                   (iterator __first,iterator __last,iterator __result)

{
  pair<QString,_int> *ppVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  long lVar5;
  pair<QString,_int> *ppVar6;
  
  lVar5 = (long)__last.i - (long)__first.i >> 5;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    ppVar6 = __last.i + -1;
    do {
      ppVar1 = __result.i + -1;
      pDVar2 = __result.i[-1].first.d.d;
      __result.i[-1].first.d.d = (ppVar6->first).d.d;
      (ppVar6->first).d.d = pDVar2;
      pcVar3 = __result.i[-1].first.d.ptr;
      __result.i[-1].first.d.ptr = (ppVar6->first).d.ptr;
      (ppVar6->first).d.ptr = pcVar3;
      qVar4 = __result.i[-1].first.d.size;
      __result.i[-1].first.d.size = (ppVar6->first).d.size;
      (ppVar6->first).d.size = qVar4;
      __result.i[-1].second = ppVar6->second;
      lVar5 = lVar5 + -1;
      ppVar6 = ppVar6 + -1;
      __result.i = ppVar1;
    } while (1 < lVar5);
    return (iterator)ppVar1;
  }
  return (iterator)__result.i;
}

Assistant:

inline qsizetype operator-(iterator j) const { return i - j.i; }